

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O0

void duckdb::RowOperations::HeapScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType PVar1;
  bool bVar2;
  LogicalType *pLVar3;
  undefined8 uVar4;
  Vector *in_RCX;
  optional_ptr<duckdb::NestedValidity,_true> in_RDX;
  Vector *in_RDI;
  idx_t in_R8;
  UnifiedVectorFormat vdata;
  LogicalType *in_stack_000004d8;
  data_ptr_t *in_stack_00003ff8;
  idx_t in_stack_00004000;
  SelectionVector *in_stack_00004008;
  idx_t in_stack_00004010;
  Vector *in_stack_00004018;
  optional_ptr<duckdb::NestedValidity,_true> in_stack_00004020;
  idx_t in_stack_00004030;
  data_ptr_t *in_stack_000080c8;
  idx_t in_stack_000080d0;
  SelectionVector *in_stack_000080d8;
  idx_t in_stack_000080e0;
  Vector *in_stack_000080e8;
  optional_ptr<duckdb::NestedValidity,_true> in_stack_000080f0;
  idx_t in_stack_00008100;
  UnifiedVectorFormat *in_stack_fffffffffffffed0;
  UnifiedVectorFormat *in_stack_fffffffffffffee0;
  allocator *paVar5;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  NotImplementedException *in_stack_ffffffffffffff40;
  data_ptr_t *in_stack_ffffffffffffff78;
  idx_t in_stack_ffffffffffffff80;
  SelectionVector *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  PhysicalType in_stack_ffffffffffffff97;
  UnifiedVectorFormat *in_stack_ffffffffffffff98;
  optional_ptr<duckdb::NestedValidity,_true> in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffb0;
  data_ptr_t *in_stack_ffffffffffffffb8;
  idx_t in_stack_ffffffffffffffc0;
  SelectionVector *in_stack_ffffffffffffffc8;
  
  pLVar3 = Vector::GetType(in_RDI);
  PVar1 = LogicalType::InternalType(pLVar3);
  bVar2 = TypeIsConstantSize(PVar1);
  if (bVar2) {
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffee0);
    Vector::ToUnifiedFormat
              ((Vector *)in_stack_ffffffffffffffa0.ptr,(idx_t)in_stack_ffffffffffffff98,
               (UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
    ;
    pLVar3 = Vector::GetType(in_RDI);
    LogicalType::InternalType(pLVar3);
    HeapScatterVData(in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffffb0);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  }
  else {
    pLVar3 = Vector::GetType(in_RDI);
    PVar1 = LogicalType::InternalType(pLVar3);
    if (PVar1 == VARCHAR) {
      HeapScatterStringVector
                (in_RCX,in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8,in_RDX,(idx_t)in_RDI);
    }
    else if (PVar1 == LIST) {
      HeapScatterListVector
                (in_stack_000080e8,in_stack_000080e0,in_stack_000080d8,in_stack_000080d0,
                 in_stack_000080c8,in_stack_000080f0,in_stack_00008100);
    }
    else if (PVar1 == STRUCT) {
      HeapScatterStructVector
                (in_stack_00004018,in_stack_00004010,in_stack_00004008,in_stack_00004000,
                 in_stack_00003ff8,in_stack_00004020,in_stack_00004030);
    }
    else {
      if (PVar1 != ARRAY) {
        uVar4 = __cxa_allocate_exception(0x10);
        paVar5 = &local_d1;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff30,
                   "Serialization of variable length vector with type %s",paVar5);
        Vector::GetType(in_RDI);
        LogicalType::ToString_abi_cxx11_(in_stack_000004d8);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        __cxa_throw(uVar4,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      HeapScatterArrayVector
                (in_stack_000080e8,in_stack_000080e0,in_stack_000080d8,in_stack_000080d0,
                 in_stack_000080c8,in_stack_000080f0,in_stack_00008100);
    }
  }
  return;
}

Assistant:

void RowOperations::HeapScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	if (TypeIsConstantSize(v.GetType().InternalType())) {
		UnifiedVectorFormat vdata;
		v.ToUnifiedFormat(vcount, vdata);
		RowOperations::HeapScatterVData(vdata, v.GetType().InternalType(), sel, ser_count, key_locations,
		                                parent_validity, offset);
	} else {
		switch (v.GetType().InternalType()) {
		case PhysicalType::VARCHAR:
			HeapScatterStringVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::STRUCT:
			HeapScatterStructVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::LIST:
			HeapScatterListVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		case PhysicalType::ARRAY:
			HeapScatterArrayVector(v, vcount, sel, ser_count, key_locations, parent_validity, offset);
			break;
		default:
			// LCOV_EXCL_START
			throw NotImplementedException("Serialization of variable length vector with type %s",
			                              v.GetType().ToString());
			// LCOV_EXCL_STOP
		}
	}
}